

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_start_map(Parser *this,bool as_child)

{
  byte *pbVar1;
  uint uVar2;
  pfn_error p_Var3;
  size_t sVar4;
  Tree *pTVar5;
  size_t i;
  code *pcVar6;
  Location LVar7;
  undefined1 auVar8 [24];
  Location LVar9;
  Location LVar10;
  Location LVar11;
  bool bVar12;
  NodeData *pNVar13;
  NodeData *pNVar14;
  size_t *psVar15;
  size_t ichild;
  State *pSVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  byte bVar21;
  csubstr cVar22;
  char msg [58];
  size_t local_b0;
  size_t local_88;
  size_t local_60;
  size_t local_38;
  
  bVar21 = 0;
  this->m_state->flags = this->m_state->flags & 0xffffff39U | 0x84;
  if ((this->m_stack).m_size == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    msg._24_16_ = (undefined1  [16])
                  to_csubstr(
                            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                            );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '_';
    msg[9] = '\\';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    (*(code *)PTR_error_impl_00231548)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
  }
  pNVar13 = node(this,(this->m_stack).m_stack);
  pNVar14 = node(this,this->m_root_id);
  if (pNVar13 != pNVar14) {
    builtin_strncpy(msg + 0x30,"root_id))",10);
    builtin_strncpy(msg + 0x28," node(m_",8);
    builtin_strncpy(msg,"check failed: (node(m_stack.bottom()) ==",0x28);
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_38 = cVar22.len;
    auVar8 = ZEXT1224(ZEXT412(0x780f) << 0x40);
    LVar7.name.str._0_4_ = (int)cVar22.str;
    LVar7.super_LineCol.offset = auVar8._0_8_;
    LVar7.super_LineCol.line = auVar8._8_8_;
    LVar7.super_LineCol.col = auVar8._16_8_;
    LVar7.name.str._4_4_ = cVar22.str._4_4_;
    LVar7.name.len = local_38;
    (*p_Var3)(msg,0x3a,LVar7,(this->m_stack).m_callbacks.m_user_data);
  }
  uVar20 = (this->m_stack).m_size;
  psVar15 = &(this->m_stack).m_stack[uVar20 - 2].node_id;
  if (uVar20 < 2) {
    psVar15 = &this->m_root_id;
  }
  sVar4 = *psVar15;
  if (sVar4 == 0xffffffffffffffff) {
    builtin_strncpy(msg + 0x10,"arent_id",8);
    builtin_strncpy(msg,"check failed: (p",0x10);
    builtin_strncpy(msg + 0x18," != NONE)",10);
    if (((byte)s_error_flags & 1) != 0) {
      bVar12 = is_debugger_attached();
      if (bVar12) {
        pcVar6 = (code *)swi(3);
        (*pcVar6)();
        return;
      }
    }
    p_Var3 = (this->m_stack).m_callbacks.m_error;
    cVar22 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_60 = cVar22.len;
    auVar8 = ZEXT1224(ZEXT412(0x7811) << 0x40);
    LVar9.name.str._0_4_ = (int)cVar22.str;
    LVar9.super_LineCol.offset = auVar8._0_8_;
    LVar9.super_LineCol.line = auVar8._8_8_;
    LVar9.super_LineCol.col = auVar8._16_8_;
    LVar9.name.str._4_4_ = cVar22.str._4_4_;
    LVar9.name.len = local_60;
    (*p_Var3)(msg,0x22,LVar9,(this->m_stack).m_callbacks.m_user_data);
  }
  pNVar13 = node(this,this->m_state);
  if (pNVar13 != (NodeData *)0x0) {
    pNVar13 = node(this,this->m_state);
    pNVar14 = node(this,this->m_root_id);
    if (pNVar13 != pNVar14) {
      pcVar18 = "check failed: (node(m_state) == nullptr || node(m_state) == node(m_root_id))";
      pcVar19 = msg;
      for (lVar17 = 0x4d; lVar17 != 0; lVar17 = lVar17 + -1) {
        *pcVar19 = *pcVar18;
        pcVar18 = pcVar18 + (ulong)bVar21 * -2 + 1;
        pcVar19 = pcVar19 + (ulong)bVar21 * -2 + 1;
      }
      if (((byte)s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      p_Var3 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_88 = cVar22.len;
      auVar8 = ZEXT1224(ZEXT412(0x7812) << 0x40);
      LVar10.name.str._0_4_ = (int)cVar22.str;
      LVar10.super_LineCol.offset = auVar8._0_8_;
      LVar10.super_LineCol.line = auVar8._8_8_;
      LVar10.super_LineCol.col = auVar8._16_8_;
      LVar10.name.str._4_4_ = cVar22.str._4_4_;
      LVar10.name.len = local_88;
      (*p_Var3)(msg,0x4d,LVar10,(this->m_stack).m_callbacks.m_user_data);
    }
  }
  if (as_child) {
    pTVar5 = this->m_tree;
    pNVar13 = Tree::_p(pTVar5,sVar4);
    i = pNVar13->m_last_child;
    if (sVar4 == 0xffffffffffffffff) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      msg._24_16_ = (undefined1  [16])
                    to_csubstr(
                              "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                              );
      msg[0] = '\0';
      msg[1] = '\0';
      msg[2] = '\0';
      msg[3] = '\0';
      msg[4] = '\0';
      msg[5] = '\0';
      msg[6] = '\0';
      msg[7] = '\0';
      msg[8] = -0x4f;
      msg[9] = 'L';
      msg[10] = '\0';
      msg[0xb] = '\0';
      msg[0xc] = '\0';
      msg[0xd] = '\0';
      msg[0xe] = '\0';
      msg[0xf] = '\0';
      msg[0x10] = '\0';
      msg[0x11] = '\0';
      msg[0x12] = '\0';
      msg[0x13] = '\0';
      msg[0x14] = '\0';
      msg[0x15] = '\0';
      msg[0x16] = '\0';
      msg[0x17] = '\0';
      (*(code *)PTR_error_impl_00231548)
                ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks);
    }
    pNVar13 = Tree::_p(pTVar5,sVar4);
    if (((pNVar13->m_type).type & (STREAM|MAP)) == NOTYPE) {
      bVar12 = Tree::is_root(pTVar5,sVar4);
      if (!bVar12) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        msg._24_16_ = (undefined1  [16])
                      to_csubstr(
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4e;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        (*(code *)PTR_error_impl_00231548)
                  ("check failed: is_container(parent) || is_root(parent)",0x35,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    if (i != 0xffffffffffffffff) {
      pNVar13 = Tree::_p(pTVar5,i);
      if (pNVar13->m_parent != sVar4) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        msg._24_16_ = (undefined1  [16])
                      to_csubstr(
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = -0x4d;
        msg[9] = 'L';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        (*(code *)PTR_error_impl_00231548)
                  ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                   (anonymous_namespace)::s_default_callbacks);
      }
    }
    ichild = Tree::_claim(pTVar5);
    Tree::_set_hierarchy(pTVar5,ichild,sVar4,i);
    pSVar16 = this->m_state;
    pSVar16->node_id = ichild;
    uVar2 = pSVar16->flags;
    if ((uVar2 >> 9 & 1) == 0) {
      Tree::to_map(this->m_tree,ichild,0);
    }
    else {
      cVar22 = _consume_scalar(this);
      Tree::to_map(this->m_tree,this->m_state->node_id,cVar22,(ulong)((uVar2 & 0x400) << 3));
      _write_key_anchor(this,this->m_state->node_id);
      if ((this->m_key_tag).str != (char *)0x0 && (this->m_key_tag).len != 0) {
        pTVar5 = this->m_tree;
        sVar4 = this->m_state->node_id;
        cVar22 = normalize_tag(this->m_key_tag);
        Tree::set_key_tag(pTVar5,sVar4,cVar22);
        (this->m_key_tag).str = (char *)0x0;
        (this->m_key_tag).len = 0;
      }
    }
    pcVar18 = (this->m_state->line_contents).rem.str;
    pNVar13 = Tree::_p(this->m_tree,this->m_state->node_id);
    (pNVar13->m_val).scalar.str = pcVar18;
    _write_val_anchor(this,this->m_state->node_id);
  }
  else {
    if (sVar4 == 0xffffffffffffffff) {
      builtin_strncpy(msg + 0x10,"arent_id",8);
      builtin_strncpy(msg,"check failed: (p",0x10);
      builtin_strncpy(msg + 0x18," != NONE)",10);
      if (((byte)s_error_flags & 1) != 0) {
        bVar12 = is_debugger_attached();
        if (bVar12) {
          pcVar6 = (code *)swi(3);
          (*pcVar6)();
          return;
        }
      }
      p_Var3 = (this->m_stack).m_callbacks.m_error;
      cVar22 = to_csubstr(
                         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                         );
      local_b0 = cVar22.len;
      auVar8 = ZEXT1224(ZEXT412(0x7830) << 0x40);
      LVar11.name.str._0_4_ = (int)cVar22.str;
      LVar11.super_LineCol.offset = auVar8._0_8_;
      LVar11.super_LineCol.line = auVar8._8_8_;
      LVar11.super_LineCol.col = auVar8._16_8_;
      LVar11.name.str._4_4_ = cVar22.str._4_4_;
      LVar11.name.len = local_b0;
      (*p_Var3)(msg,0x22,LVar11,(this->m_stack).m_callbacks.m_user_data);
    }
    this->m_state->node_id = sVar4;
    pNVar13 = Tree::_p(this->m_tree,sVar4);
    uVar20 = (ulong)((uint)(pNVar13->m_type).type & 0x10);
    pNVar13 = Tree::_p(this->m_tree,sVar4);
    if (((pNVar13->m_type).type & MAP) == NOTYPE) {
      bVar12 = Tree::has_children(this->m_tree,sVar4);
      if (bVar12) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar12 = is_debugger_attached();
          if (bVar12) {
            pcVar6 = (code *)swi(3);
            (*pcVar6)();
            return;
          }
        }
        msg._24_16_ = (undefined1  [16])
                      to_csubstr(
                                "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                                );
        msg[0] = '\0';
        msg[1] = '\0';
        msg[2] = '\0';
        msg[3] = '\0';
        msg[4] = '\0';
        msg[5] = '\0';
        msg[6] = '\0';
        msg[7] = '\0';
        msg[8] = '8';
        msg[9] = 'x';
        msg[10] = '\0';
        msg[0xb] = '\0';
        msg[0xc] = '\0';
        msg[0xd] = '\0';
        msg[0xe] = '\0';
        msg[0xf] = '\0';
        msg[0x10] = '\0';
        msg[0x11] = '\0';
        msg[0x12] = '\0';
        msg[0x13] = '\0';
        msg[0x14] = '\0';
        msg[0x15] = '\0';
        msg[0x16] = '\0';
        msg[0x17] = '\0';
        (*(code *)PTR_error_impl_00231548)
                  ("check failed: !m_tree->has_children(parent_id)",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      Tree::to_map(this->m_tree,sVar4,uVar20);
    }
    else {
      Tree::_add_flags(this->m_tree,sVar4,uVar20);
    }
    _move_scalar_from_top(this);
    if (((this->m_key_anchor).len != 0) && ((this->m_key_anchor).str != (char *)0x0)) {
      this->m_key_anchor_was_before = true;
    }
    _write_val_anchor(this,sVar4);
    uVar20 = (this->m_stack).m_size;
    if (uVar20 < 2) {
      pSVar16 = this->m_state;
    }
    else {
      pSVar16 = this->m_state;
      if (((this->m_stack).m_stack[uVar20 - 2].flags & 0x800) != 0) {
        pbVar1 = (byte *)((long)&pSVar16->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
    }
    pcVar18 = (pSVar16->line_contents).rem.str;
    pNVar13 = Tree::_p(this->m_tree,sVar4);
    (pNVar13->m_val).scalar.str = pcVar18;
  }
  if ((this->m_val_tag).str != (char *)0x0 && (this->m_val_tag).len != 0) {
    pTVar5 = this->m_tree;
    sVar4 = this->m_state->node_id;
    cVar22 = normalize_tag(this->m_val_tag);
    Tree::set_val_tag(pTVar5,sVar4,cVar22);
    (this->m_val_tag).str = (char *)0x0;
    (this->m_val_tag).len = 0;
  }
  return;
}

Assistant:

void Parser::_start_map(bool as_child)
{
    _c4dbgpf("start_map (as child={})", as_child);
    addrem_flags(RMAP|RVAL, RKEY|RUNK);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_stack.bottom()) == node(m_root_id));
    size_t parent_id = m_stack.size() < 2 ? m_root_id : m_stack.top(1).node_id;
    _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
    _RYML_CB_ASSERT(m_stack.m_callbacks, node(m_state) == nullptr || node(m_state) == node(m_root_id));
    if(as_child)
    {
        m_state->node_id = m_tree->append_child(parent_id);
        if(has_all(SSCL))
        {
            type_bits key_quoted = NOTYPE;
            if(m_state->flags & QSCL) // before consuming the scalar
                key_quoted |= KEYQUO;
            csubstr key = _consume_scalar();
            m_tree->to_map(m_state->node_id, key, key_quoted);
            _c4dbgpf("start_map: id={} key='{}'", m_state->node_id, m_tree->key(m_state->node_id));
            _write_key_anchor(m_state->node_id);
            if( ! m_key_tag.empty())
            {
                _c4dbgpf("node[{}]: set key tag='{}' -> '{}'", m_state->node_id, m_key_tag, normalize_tag(m_key_tag));
                m_tree->set_key_tag(m_state->node_id, normalize_tag(m_key_tag));
                m_key_tag.clear();
            }
        }
        else
        {
            m_tree->to_map(m_state->node_id);
            _c4dbgpf("start_map: id={}", m_state->node_id);
        }
        m_tree->_p(m_state->node_id)->m_val.scalar.str = m_state->line_contents.rem.str;
        _write_val_anchor(m_state->node_id);
    }
    else
    {
        _RYML_CB_ASSERT(m_stack.m_callbacks, parent_id != NONE);
        m_state->node_id = parent_id;
        _c4dbgpf("start_map: id={}", m_state->node_id);
        type_bits as_doc = 0;
        if(m_tree->is_doc(m_state->node_id))
            as_doc |= DOC;
        if(!m_tree->is_map(parent_id))
        {
            RYML_CHECK(!m_tree->has_children(parent_id));
            m_tree->to_map(parent_id, as_doc);
        }
        else
        {
            m_tree->_add_flags(parent_id, as_doc);
        }
        _move_scalar_from_top();
        if(m_key_anchor.not_empty())
            m_key_anchor_was_before = true;
        _write_val_anchor(parent_id);
        if(m_stack.size() >= 2)
        {
            State const& parent_state = m_stack.top(1);
            if(parent_state.flags & RSET)
                add_flags(RSET);
        }
        m_tree->_p(parent_id)->m_val.scalar.str = m_state->line_contents.rem.str;
    }
    if( ! m_val_tag.empty())
    {
        _c4dbgpf("node[{}]: set val tag='{}' -> '{}'", m_state->node_id, m_val_tag, normalize_tag(m_val_tag));
        m_tree->set_val_tag(m_state->node_id, normalize_tag(m_val_tag));
        m_val_tag.clear();
    }
}